

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O2

SignParameter * __thiscall
cfd::SignParameter::operator=(SignParameter *this,SignParameter *sign_parameter)

{
  ScriptOperator SStack_48;
  
  if (this != sign_parameter) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&SStack_48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)sign_parameter);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&SStack_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&SStack_48);
    this->data_type_ = sign_parameter->data_type_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&SStack_48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &sign_parameter->related_pubkey_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->related_pubkey_,
               &SStack_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&SStack_48);
    this->der_encode_ = sign_parameter->der_encode_;
    cfd::core::SigHashType::SigHashType((SigHashType *)&SStack_48,&sign_parameter->sighash_type_);
    cfd::core::SigHashType::operator=(&this->sighash_type_,(SigHashType *)&SStack_48);
    cfd::core::ScriptOperator::ScriptOperator(&SStack_48,&sign_parameter->op_code_);
    cfd::core::ScriptOperator::operator=(&this->op_code_,&SStack_48);
    core::ScriptOperator::~ScriptOperator(&SStack_48);
  }
  return this;
}

Assistant:

SignParameter& SignParameter::operator=(const SignParameter& sign_parameter) {
  if (this != &sign_parameter) {
    data_ = sign_parameter.GetData();
    data_type_ = sign_parameter.GetDataType();
    related_pubkey_ = sign_parameter.GetRelatedPubkey();
    der_encode_ = sign_parameter.IsDerEncode();
    sighash_type_ = sign_parameter.GetSigHashType();
    op_code_ = sign_parameter.GetOpCode();
  }
  return *this;
}